

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest10::iterate(FunctionalTest10 *this)

{
  ostringstream *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  GLint GVar4;
  GLint GVar5;
  NotSupportedError *pNVar6;
  socklen_t __len;
  sockaddr *__addr;
  char *description;
  int __fd;
  long lVar7;
  buffer transform_feedback_buffer;
  vertexArray vao;
  program program;
  undefined1 local_1a8 [384];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)&program);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a8);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_arrays_of_arrays");
  if (bVar1) {
    transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    transform_feedback_buffer.m_id = 0;
    vao.m_id = 0;
    __fd = 0;
    __len = 0;
    vao.m_context = transform_feedback_buffer.m_context;
    program.m_context = transform_feedback_buffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_arrays_of_arrays  : require\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine int routine_type(in int iparam);\n\n// Subroutine definitions\nsubroutine(routine_type) int increment(in int iparam)\n{\n    return iparam + 1;\n}\n\nsubroutine(routine_type) int decrement(in int iparam)\n{\n    return iparam - 1;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine[4][4];\n\n// Output\nout int out_result;\n\nvoid main()\n{\n    int result = 0;\n    \n    for (uint j = 0; j < routine.length(); ++j)\n    {\n        for (uint i = 0; i < routine[j].length(); ++i)\n        {\n            result = routine[j][i](result);\n        }\n    }\n    \n    out_result = result;\n}\n\n"
               ,&iterate::varying_name,1,false);
    Utils::program::use(&program);
    Utils::vertexArray::generate(&vao);
    Utils::vertexArray::bind(&vao,__fd,__addr,__len);
    Utils::buffer::generate(&transform_feedback_buffer);
    Utils::buffer::update(&transform_feedback_buffer,0x8c8e,4,(GLvoid *)0x0,0x88ea);
    Utils::buffer::bindRange(&transform_feedback_buffer,0x8c8e,0,0,4);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 4) {
      GVar2 = Utils::program::getSubroutineIndex
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest107iterateEvE16subroutine_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest107iterateEvE16subroutine_names_rel
                                                  + lVar7)),0x8b31);
      *(GLuint *)((long)this->m_subroutine_indices + lVar7) = GVar2;
    }
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 4) {
      GVar3 = Utils::program::getSubroutineUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest107iterateEvE24subroutine_uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest107iterateEvE24subroutine_uniform_names_rel
                                                  + lVar7)),0x8b31);
      *(GLint *)((long)this->m_subroutine_uniform_locations + lVar7) = GVar3;
    }
    GVar3 = testDraw(this,iterate::configuration_increment);
    GVar4 = testDraw(this,iterate::configuration_decrement);
    GVar5 = testDraw(this,iterate::configuration_mix);
    if ((GVar4 == -0x10 && GVar3 == 0x10) && GVar5 == 0) {
      description = "Pass";
    }
    else {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Error. Invalid result.");
      std::operator<<((ostream *)this_00," Incrementation applied 16 times: ");
      std::ostream::operator<<(this_00,GVar3);
      std::operator<<((ostream *)this_00,". Decrementation applied 16 times: ");
      std::ostream::operator<<(this_00,GVar4);
      std::operator<<((ostream *)this_00,". Incrementation and decrementation applied 8 times: ");
      std::ostream::operator<<(this_00,GVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((GVar4 != -0x10 || GVar3 != 0x10) || GVar5 != 0),description);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::buffer::~buffer(&transform_feedback_buffer);
    Utils::program::~program(&program);
    return STOP;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"GL_ARB_arrays_of_arrays is not supported.",
             (allocator<char> *)&program);
  tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a8);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest10::iterate()
{
	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_arrays_of_arrays  : require\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "// Subroutine type\n"
											  "subroutine int routine_type(in int iparam);\n"
											  "\n"
											  "// Subroutine definitions\n"
											  "subroutine(routine_type) int increment(in int iparam)\n"
											  "{\n"
											  "    return iparam + 1;\n"
											  "}\n"
											  "\n"
											  "subroutine(routine_type) int decrement(in int iparam)\n"
											  "{\n"
											  "    return iparam - 1;\n"
											  "}\n"
											  "\n"
											  "// Sub routine uniform\n"
											  "subroutine uniform routine_type routine[4][4];\n"
											  "\n"
											  "// Output\n"
											  "out int out_result;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    int result = 0;\n"
											  "    \n"
											  "    for (uint j = 0; j < routine.length(); ++j)\n"
											  "    {\n"
											  "        for (uint i = 0; i < routine[j].length(); ++i)\n"
											  "        {\n"
											  "            result = routine[j][i](result);\n"
											  "        }\n"
											  "    }\n"
											  "    \n"
											  "    out_result = result;\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = {
		"increment", "decrement",
	};
	static const GLuint n_subroutine_names = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = {
		"routine[0][0]", "routine[1][0]", "routine[2][0]", "routine[3][0]", "routine[0][1]", "routine[1][1]",
		"routine[2][1]", "routine[3][1]", "routine[0][2]", "routine[1][2]", "routine[2][2]", "routine[3][2]",
		"routine[0][3]", "routine[1][3]", "routine[2][3]", "routine[3][3]"
	};
	static const GLuint n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* varying_name					= "out_result";
	static const GLuint  transform_feedback_buffer_size = sizeof(GLint);

	static const GLuint configuration_increment[16] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	static const GLuint configuration_decrement[16] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1 };

	static const GLuint configuration_mix[16] = { 1, 0, 0, 1, 1, 0, 0, 1, 1, 0, 0, 1, 1, 0, 0, 1 };

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Do not execute the test if GL_ARB_arrays_of_arrays is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_arrays_of_arrays"))
	{
		throw tcu::NotSupportedError("GL_ARB_arrays_of_arrays is not supported.");
	}

	bool result = true;

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, &varying_name,
				  1 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine indices */
	for (GLuint routine = 0; routine < n_subroutine_names; ++routine)
	{
		m_subroutine_indices[routine] = program.getSubroutineIndex(subroutine_names[routine], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Test */
	GLint increment_result = testDraw(configuration_increment);
	GLint decrement_result = testDraw(configuration_decrement);
	GLint mix_result	   = testDraw(configuration_mix);

	/* Verify */
	if (16 != increment_result)
	{
		result = false;
	}

	if (-16 != decrement_result)
	{
		result = false;
	}
	if (0 != mix_result)
	{
		result = false;
	}

	/* Set test result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< " Incrementation applied 16 times: " << increment_result
											<< ". Decrementation applied 16 times: " << decrement_result
											<< ". Incrementation and decrementation applied 8 times: " << mix_result
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}